

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetLastItemDataForWindow(ImGuiWindow *window,ImRect *rect)

{
  ImGuiID IVar1;
  ImGuiItemFlags IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  
  IVar1 = window->MoveId;
  IVar2 = GImGui->CurrentItemFlags;
  bVar5 = IsMouseHoveringRect(&rect->Min,&rect->Max,false);
  pIVar4 = GImGui;
  (GImGui->LastItemData).ID = IVar1;
  (pIVar4->LastItemData).InFlags = IVar2;
  (pIVar4->LastItemData).StatusFlags = (uint)bVar5;
  IVar3 = rect->Max;
  (pIVar4->LastItemData).NavRect.Min = rect->Min;
  (pIVar4->LastItemData).NavRect.Max = IVar3;
  IVar3 = rect->Max;
  (pIVar4->LastItemData).Rect.Min = rect->Min;
  (pIVar4->LastItemData).Rect.Max = IVar3;
  return;
}

Assistant:

static void ImGui::SetLastItemDataForWindow(ImGuiWindow* window, const ImRect& rect)
{
    ImGuiContext& g = *GImGui;
    SetLastItemData(window->MoveId, g.CurrentItemFlags, IsMouseHoveringRect(rect.Min, rect.Max, false) ? ImGuiItemStatusFlags_HoveredRect : 0, rect);
}